

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRect __thiscall
QStyleSheetStyle::subControlRect
          (QStyleSheetStyle *this,ComplexControl cc,QStyleOptionComplex *opt,SubControl sc,
          QWidget *w)

{
  QRect *pQVar1;
  undefined8 uVar2;
  SubControl SVar3;
  Int IVar4;
  ButtonSymbols BVar5;
  undefined1 auVar6 [16];
  Int IVar7;
  QStyleSheetStyle *pQVar8;
  undefined8 uVar9;
  QSharedDataPointer<QStyleSheetGeometryData> QVar10;
  bool bVar11;
  uint uVar12;
  Representation RVar15;
  uint uVar16;
  Representation RVar17;
  QStyle *pQVar18;
  int iVar13;
  int iVar14;
  QSize QVar19;
  QStyleOptionComplex *pQVar20;
  QRenderRule *pQVar21;
  QSize QVar22;
  QStyleSheetGeometryData *ptr;
  QStyleSheetPositionData *ptr_00;
  uint uVar23;
  ulong uVar24;
  int *piVar25;
  int iVar26;
  Representation RVar27;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar28;
  Origin OVar29;
  Representation RVar30;
  Representation RVar31;
  QVariant *val;
  QVariant *pQVar32;
  Representation RVar33;
  QStyleSheetStyle *pQVar34;
  QStyleOptionComplex *pQVar35;
  char cVar36;
  undefined8 *puVar37;
  LayoutDirection LVar38;
  uint range;
  int iVar39;
  Representation RVar40;
  uint uVar41;
  QStyleOptionComboBox *other;
  QStyleOptionGroupBox *other_00;
  QStyleOptionToolButton *other_01;
  uint uVar42;
  Representation RVar43;
  QStyleOptionSpinBox *other_02;
  long lVar44;
  int iVar45;
  ulong uVar46;
  long in_FS_OFFSET;
  byte bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  QByteArrayView layout;
  QRect QVar51;
  QRect QVar52;
  QRect QVar53;
  QRenderRule downRule;
  QRenderRule rule;
  QRenderRule upRule;
  QRenderRule *local_2c8;
  undefined1 local_298 [12];
  Representation RStack_28c;
  SubControl local_27c;
  undefined1 local_278 [12];
  Representation RStack_26c;
  undefined1 local_268 [16];
  undefined1 *local_258;
  QPalettePrivate *pQStack_250;
  undefined1 *local_248;
  QObject *pQStack_240;
  undefined1 *local_238;
  undefined1 *puStack_230;
  Data *local_228;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  QRect QStack_1d8;
  QHash<QString,_QVariant> local_1c0;
  QSharedDataPointer<QStyleSheetPaletteData> local_1b8;
  QSharedDataPointer<QStyleSheetBoxData> local_1b0;
  QSharedDataPointer<QStyleSheetBackgroundData> local_1a8;
  QSharedDataPointer<QStyleSheetBorderData> local_1a0;
  QSharedDataPointer<QStyleSheetOutlineData> QStack_198;
  QSharedDataPointer<QStyleSheetGeometryData> local_190;
  QSharedDataPointer<QStyleSheetPositionData> QStack_188;
  QSharedDataPointer<QStyleSheetImageData> local_180;
  QSharedDataPointer<QStyleSheetImageData> QStack_178;
  ulong local_170;
  QPainterPath local_168 [8];
  QRenderRule local_160;
  undefined1 local_d8 [8];
  int iStack_d0;
  int iStack_cc;
  QRect local_c8;
  QHash<QString,_QVariant> local_b0;
  QSharedDataPointer<QStyleSheetPaletteData> local_a8;
  QSharedDataPointer<QStyleSheetBoxData> local_a0;
  QSharedDataPointer<QStyleSheetBackgroundData> local_98;
  QSharedDataPointer<QStyleSheetBorderData> local_90;
  QSharedDataPointer<QStyleSheetOutlineData> local_88;
  QSize local_80;
  QSharedDataPointer<QStyleSheetPositionData> local_78;
  QSharedDataPointer<QStyleSheetImageData> local_70;
  QSharedDataPointer<QStyleSheetImageData> local_68 [2];
  QPainterPath local_58 [32];
  long local_38;
  
  pQVar8 = globalStyleSheetStyle;
  bVar47 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_27c = sc;
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar18 = baseStyle(this);
    QVar51 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))(pQVar18,cc,opt,local_27c,w);
    pQVar34 = (QStyleSheetStyle *)(QVar51._0_8_ >> 0x20);
    goto LAB_0036c330;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  pQVar21 = &local_160;
  memset(pQVar21,0xaa,0x88);
  renderRule(pQVar21,this,&w->super_QObject,&opt->super_QStyleOption,0);
  pQVar34 = this;
  switch(cc) {
  case CC_SpinBox:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       (other_02 = (QStyleOptionSpinBox *)opt, (opt->super_QStyleOption).type != 0xf0002)) {
      other_02 = (QStyleOptionSpinBox *)0x0;
    }
    if (other_02 == (QStyleOptionSpinBox *)0x0) goto switchD_0036b4b4_caseD_6;
    memset((QRenderRule *)local_d8,0xaa,0x88);
    renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0xb);
    memset((QRenderRule *)local_1e8,0xaa,0x88);
    renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,0xd);
    bVar11 = true;
    if (local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) {
      if (local_160.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
        bVar11 = false;
      }
      else if ((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68)
                )->d).ptr == (QStyleSheetBorderImageData *)0x0) {
        bVar11 = *(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) != BorderStyle_Native;
      }
    }
    if (((bVar11) || (local_78.d.ptr != (QStyleSheetPositionData *)0x0 || local_80 != (QSize)0x0))
       || (QStack_188.d.ptr != (QStyleSheetPositionData *)0x0 ||
           local_190.d.ptr != (QStyleSheetGeometryData *)0x0)) {
      switch(local_27c) {
      case SC_ComboBoxFrame:
        if (local_78.d.ptr == (QStyleSheetPositionData *)0x0 && local_80 == (QSize)0x0)
        goto switchD_0036c09d_caseD_3;
        LVar38 = (opt->super_QStyleOption).direction;
        pQVar21 = (QRenderRule *)local_d8;
        iVar26 = 0xb;
LAB_0036cd4b:
        QVar53 = positionRect(this,w,&local_160,pQVar21,iVar26,&(opt->super_QStyleOption).rect,
                              LVar38);
        break;
      case SC_ComboBoxEditField:
        if (QStack_188.d.ptr != (QStyleSheetPositionData *)0x0 ||
            local_190.d.ptr != (QStyleSheetGeometryData *)0x0) {
          LVar38 = (opt->super_QStyleOption).direction;
          pQVar21 = (QRenderRule *)local_1e8;
          iVar26 = 0xd;
          goto LAB_0036cd4b;
        }
      default:
switchD_0036c09d_caseD_3:
        pQVar18 = baseStyle(this);
        QVar53 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))(pQVar18,0,opt,local_27c,w);
        break;
      case SC_ComboBoxArrow:
        QVar53 = QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
        break;
      case SC_ComboBoxListBoxPopup:
        QVar51 = QRenderRule::contentsRect(&local_160,&(opt->super_QStyleOption).rect);
        if (local_78.d.ptr == (QStyleSheetPositionData *)0x0) {
          uVar12 = 2;
        }
        else {
          uVar12 = (((Alignment *)((long)local_78.d.ptr + 0x18))->
                   super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                   super_QFlagsStorage<Qt::AlignmentFlag>.i;
        }
        LVar38 = (opt->super_QStyleOption).direction;
        uVar23 = uVar12;
        if (((LVar38 != LeftToRight) && ((uVar12 & 0x10) == 0)) &&
           ((uVar23 = 2, (uVar12 & 1) == 0 && (uVar23 = 1, (uVar12 & 2) == 0)))) {
          uVar23 = uVar12;
        }
        if (QStack_188.d.ptr == (QStyleSheetPositionData *)0x0) {
          uVar12 = 2;
        }
        else {
          uVar12 = (((Alignment *)((long)QStack_188.d.ptr + 0x18))->
                   super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                   super_QFlagsStorage<Qt::AlignmentFlag>.i;
        }
        uVar41 = uVar12;
        if ((((LVar38 != LeftToRight) && ((uVar12 & 0x10) == 0)) && (uVar41 = 2, (uVar12 & 1) == 0))
           && (uVar41 = 1, (uVar12 & 2) == 0)) {
          uVar41 = uVar12;
        }
        BVar5 = other_02->buttonSymbols;
        uVar12 = 0;
        if (BVar5 != NoButtons) {
          iVar26 = (**(code **)(*(long *)this + 0xd8))(this,0,opt,1,w);
          uVar12 = (extraout_EDX - iVar26) + 1;
        }
        uVar28 = 0;
        if (BVar5 != NoButtons) {
          iVar26 = (**(code **)(*(long *)this + 0xd8))(this,0,opt,2,w);
          uVar28 = (extraout_EDX_00 - iVar26) + 1;
        }
        uVar16 = -(uVar23 & 1) & uVar12;
        uVar42 = -(uVar41 & 1) & uVar28;
        if ((int)uVar42 < (int)uVar16) {
          uVar42 = uVar16;
        }
        uVar12 = (int)(uVar23 << 0x1e) >> 0x1f & uVar12;
        uVar28 = (int)(uVar41 << 0x1e) >> 0x1f & uVar28;
        if ((int)uVar28 < (int)uVar12) {
          uVar28 = uVar12;
        }
        uVar24 = QVar51._8_8_ & 0xffffffff00000000 | (ulong)(QVar51.x2.m_i.m_i - uVar28);
        QVar53.x2.m_i = (int)uVar24;
        QVar53.y2.m_i = (int)(uVar24 >> 0x20);
        QVar53.x1.m_i = (int)QVar51._0_8_;
        QVar53.y1.m_i = (int)((ulong)QVar51._0_8_ >> 0x20);
        uVar24 = (ulong)(uVar42 + QVar51.x1.m_i.m_i);
        goto LAB_0036cd7e;
      }
      uVar24 = QVar53._0_8_;
    }
    else {
      local_228 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_238 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_230 = &DAT_aaaaaaaaaaaaaaaa;
      local_248 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_240 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_258 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_250 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_268._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xfffffffffffffd90 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)local_278,other_02);
      local_268 = (undefined1  [16])
                  QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
      bVar11 = QRenderRule::baseStyleCanDraw(&local_160);
      if (bVar11) {
        pQVar18 = baseStyle(this);
        QVar53 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))(pQVar18,0,local_278,local_27c,w);
      }
      else {
        QVar53 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_SpinBox,(QStyleOptionComplex *)local_278,
                            local_27c,w);
      }
      uVar24 = QVar53._0_8_;
      QStyleOption::~QStyleOption((QStyleOption *)local_278);
    }
LAB_0036cd7e:
    QVar51.x2.m_i = (int)QVar53._8_8_;
    QVar51.y2.m_i = (int)((ulong)QVar53._8_8_ >> 0x20);
    QVar51.x1.m_i = (int)uVar24;
    QVar51.y1.m_i = (int)(uVar24 >> 0x20);
    QPainterPath::~QPainterPath(local_168);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&QStack_178);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_180);
    if (QStack_188.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)QStack_188.d.ptr = *(int *)QStack_188.d.ptr + -1;
      UNLOCK();
      if ((*(int *)QStack_188.d.ptr == 0) && (QStack_188.d.ptr != (QStyleSheetPositionData *)0x0)) {
        operator_delete((void *)QStack_188.d.ptr,0x24);
      }
    }
    if (local_190.d.ptr != (QStyleSheetGeometryData *)0x0) {
      LOCK();
      *(int *)local_190.d.ptr = *(int *)local_190.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_190.d.ptr == 0) && (local_190.d.ptr != (QStyleSheetGeometryData *)0x0)) {
        operator_delete((void *)local_190.d.ptr,0x1c);
      }
    }
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&QStack_198);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_1a0);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_1a8);
    if (local_1b0.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_1b0.d.ptr = *(int *)local_1b0.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_1b0.d.ptr == 0) && (local_1b0.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_1b0.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_1b8);
    QHash<QString,_QVariant>::~QHash(&local_1c0);
    QFont::~QFont((QFont *)&QStack_1d8);
    QBrush::~QBrush((QBrush *)(local_1e8 + 8));
    QPainterPath::~QPainterPath(local_58);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_68);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_70);
    if (local_78.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_78.d.ptr = *(int *)local_78.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_78.d.ptr == 0) && (local_78.d.ptr != (QStyleSheetPositionData *)0x0)) {
        operator_delete((void *)local_78.d.ptr,0x24);
      }
    }
    if (local_80 != (QSize)0x0) {
      LOCK();
      *(int *)local_80 = *(int *)local_80 + -1;
      UNLOCK();
      if ((*(int *)local_80 == 0) && (local_80 != (QSize)0x0)) {
        operator_delete((void *)local_80,0x1c);
      }
    }
    pQVar34 = (QStyleSheetStyle *)(QVar53._0_8_ >> 0x20);
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_88);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_90);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_98);
    if (local_a0.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_a0.d.ptr = *(int *)local_a0.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_a0.d.ptr == 0) && (local_a0.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_a0.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_a8);
    QHash<QString,_QVariant>::~QHash(&local_b0);
    QFont::~QFont((QFont *)&local_c8);
    QBrush::~QBrush((QBrush *)&iStack_d0);
    break;
  case CC_ComboBox:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       (other = (QStyleOptionComboBox *)opt, (opt->super_QStyleOption).type != 0xf0004)) {
      other = (QStyleOptionComboBox *)0x0;
    }
    if (other == (QStyleOptionComboBox *)0x0) goto switchD_0036b4b4_caseD_6;
    if ((local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((local_160.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68))->d)
          .ptr == (QStyleSheetBorderImageData *)0x0 &&
         (*(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
      memset((QStyleOptionComboBox *)local_d8,0xaa,0x90);
      QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)local_d8,other);
      local_c8 = QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
      bVar11 = QRenderRule::baseStyleCanDraw(&local_160);
      if (bVar11) {
        pQVar18 = baseStyle(this);
        QVar51 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))(pQVar18,1,local_d8,local_27c,w);
      }
      else {
        QVar51 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_ComboBox,(QStyleOptionComplex *)local_d8,
                            local_27c,w);
      }
      pQVar34 = (QStyleSheetStyle *)(QVar51._0_8_ >> 0x20);
      QStyleOptionComboBox::~QStyleOptionComboBox((QStyleOptionComboBox *)local_d8);
      break;
    }
    if (local_27c == SC_ComboBoxArrow) {
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,8);
      LVar38 = (opt->super_QStyleOption).direction;
      iVar26 = 8;
LAB_0036c944:
      QVar51 = positionRect(this,w,&local_160,(QRenderRule *)local_d8,iVar26,
                            &(opt->super_QStyleOption).rect,LVar38);
      uVar24 = QVar51._0_8_;
      goto LAB_0036d1f1;
    }
    if (local_27c == SC_ComboBoxEditField) {
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,8);
      pQVar1 = &(opt->super_QStyleOption).rect;
      uStack_1e0 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      local_1e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      _local_1e8 = QRenderRule::contentsRect(&local_160,pQVar1);
      QVar53 = positionRect(this,w,&local_160,(QRenderRule *)local_d8,8,pQVar1,
                            (opt->super_QStyleOption).direction);
      QVar51 = _local_1e8;
      if ((local_78.d.ptr == (QStyleSheetPositionData *)0x0) ||
         (((((Alignment *)((long)local_78.d.ptr + 0x18))->
           super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).super_QFlagsStorage<Qt::AlignmentFlag>.i
          & 1) == 0)) {
        LVar38 = (opt->super_QStyleOption).direction;
        RStack_26c.m_i = uStack_1e0._4_4_;
        local_278._8_4_ = ~QVar53.x2.m_i.m_i + QVar53.x1.m_i.m_i + uStack_1e0._0_4_;
        local_278._0_4_ = local_1e8._0_4_;
        local_278._4_4_ = local_1e8._4_4_;
      }
      else {
        LVar38 = (opt->super_QStyleOption).direction;
        local_278._4_4_ = local_1e8._4_4_;
        local_278._0_4_ = local_1e8._0_4_ + (QVar53.x2.m_i.m_i - QVar53.x1.m_i) + 1;
        stack0xfffffffffffffd90 = uStack_1e0;
      }
      _local_1e8 = QVar51;
      QVar51 = QStyle::visualRect(LVar38,(QRect *)local_1e8,(QRect *)local_278);
      uVar24 = QVar51._0_8_;
      goto LAB_0036d1f1;
    }
    if (local_27c == SC_ComboBoxFrame) goto LAB_0036bd95;
    pQVar18 = baseStyle(this);
    lVar44 = *(long *)pQVar18;
    cc = CC_ComboBox;
    goto LAB_0036c209;
  case CC_ScrollBar:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       (pQVar35 = opt, (opt->super_QStyleOption).type != 0xf0001)) {
      pQVar35 = (QStyleOptionComplex *)0x0;
    }
    if (pQVar35 == (QStyleOptionComplex *)0x0) goto switchD_0036b4b4_caseD_6;
    puVar37 = &DAT_0067fc50;
    pQVar20 = (QStyleOptionComplex *)local_1e8;
    for (lVar44 = 0x10; lVar44 != 0; lVar44 = lVar44 + -1) {
      uVar2 = *puVar37;
      (pQVar20->super_QStyleOption).version = (int)uVar2;
      (pQVar20->super_QStyleOption).type = (int)((ulong)uVar2 >> 0x20);
      puVar37 = puVar37 + (ulong)bVar47 * -2 + 1;
      pQVar20 = (QStyleOptionComplex *)((long)pQVar20 + (ulong)bVar47 * -0x10 + 8);
    }
    QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)local_1e8,1,0xf0001);
    local_170 = (ulong)(uint)local_170;
    QStyleOption::operator=((QStyleOption *)local_1e8,&pQVar35->super_QStyleOption);
    local_1a8.d.ptr = *(totally_ordered_wrapper<QStyleSheetBackgroundData_*> *)&pQVar35->subControls
    ;
    local_170._0_4_ = pQVar35[1].super_QStyleOption.palette.currentGroup;
    local_170._4_4_ = *(undefined4 *)&pQVar35[1].super_QStyleOption.palette.field_0xc;
    local_1a0.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetBorderData_*> *)&pQVar35[1].super_QStyleOption;
    QStack_198.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetOutlineData_*> *)&pQVar35[1].super_QStyleOption.state;
    local_190.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetGeometryData_*> *)&pQVar35[1].super_QStyleOption.rect;
    QStack_188.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetPositionData_*> *)
          &pQVar35[1].super_QStyleOption.rect.x2;
    local_180.d.ptr =
         *(totally_ordered_wrapper<QStyleSheetImageData_*> *)
          &pQVar35[1].super_QStyleOption.fontMetrics;
    QStack_178.d.ptr =
         (totally_ordered_wrapper<QStyleSheetImageData_*>)pQVar35[1].super_QStyleOption.palette.d;
    pQVar1 = &(opt->super_QStyleOption).rect;
    QStack_1d8 = QRenderRule::borderRect(&local_160,pQVar1);
    bVar11 = QRenderRule::hasDrawable(&local_160);
    if ((bVar11) || (local_160.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      _local_278 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      if (local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) {
        bVar11 = QRenderRule::baseStyleCanDraw(&local_160);
        if (bVar11) {
          pQVar18 = baseStyle(this);
          QVar51 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))(pQVar18,2,pQVar35,0x80,w);
        }
        else {
          QVar51 = QCommonStyle::subControlRect
                             ((QCommonStyle *)this,CC_ScrollBar,pQVar35,SC_ScrollBarGroove,w);
        }
      }
      else {
        QVar51 = QRenderRule::contentsRect(&local_160,pQVar1);
      }
      iVar26 = 0;
      _local_278 = QVar51;
      if (0xf < (int)local_27c) {
        if ((int)local_27c < 0x40) {
          if (local_27c == SC_ScrollBarFirst) {
            iVar26 = 0x1a;
          }
          else {
            iVar26 = 0;
            if (local_27c == SC_ScrollBarLast) {
              iVar26 = 0x1b;
            }
          }
        }
        else {
          if (local_27c == SC_ScrollBarGroove) goto LAB_0036d320;
          if (local_27c == SC_ScrollBarSlider) goto switchD_0036cffd_caseD_4;
        }
        goto switchD_0036cffd_caseD_3;
      }
      iVar26 = 0;
      switch(local_27c) {
      case SC_ComboBoxFrame:
        iVar26 = 0x18;
        break;
      case SC_ComboBoxEditField:
        iVar26 = 0x19;
        break;
      case SC_ComboBoxArrow:
      case SC_ComboBoxListBoxPopup:
switchD_0036cffd_caseD_4:
        bVar11 = hasStyleRule(this,&w->super_QObject,0x15);
        if (bVar11) {
          memset((QRenderRule *)local_d8,0xaa,0x88);
          renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x15);
          if (local_78.d.ptr == (QStyleSheetPositionData *)0x0) {
            OVar29 = Origin_Content;
          }
          else {
            OVar29 = *(Origin *)((long)local_78.d.ptr + 0x14);
          }
          QVar51 = QRenderRule::originRect(&local_160,pQVar1,OVar29);
          QRenderRule::~QRenderRule((QRenderRule *)local_d8);
        }
        RVar43 = QVar51.x1.m_i;
        RVar27 = QVar51.y1.m_i;
        RVar17.m_i = RVar27.m_i;
        if ((int)local_1a0.d.ptr == 1) {
          RVar17.m_i = RVar43.m_i;
        }
        RVar30 = QVar51.y2.m_i;
        RVar15 = QVar51.x2.m_i;
        RVar31.m_i = RVar30.m_i;
        if ((int)local_1a0.d.ptr == 1) {
          RVar31.m_i = RVar15.m_i;
        }
        iVar14 = (RVar31.m_i - RVar17.m_i) + 1;
        uVar12 = pQVar35[1].super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
                 .super_QFlagsStorage<QStyle::StateFlag>.i - pQVar35[1].super_QStyleOption.type;
        iVar26 = iVar14;
        if (uVar12 != 0) {
          iVar26 = *(int *)&pQVar35[1].super_QStyleOption.field_0x24;
          iVar39 = (**(code **)(*(long *)this + 0xe0))(this,10,pQVar35,w);
          iVar26 = (int)(((long)iVar26 * (long)iVar14) / (long)(ulong)(iVar26 + uVar12));
          if (iVar26 < iVar39) {
            iVar26 = iVar39;
          }
          if (0x3fffffff < uVar12) {
            iVar26 = iVar39;
          }
          if (iVar14 <= iVar26) {
            iVar26 = iVar14;
          }
        }
        RVar17.m_i = RVar27.m_i;
        if ((int)local_1a0.d.ptr == 1) {
          RVar17.m_i = RVar43.m_i;
        }
        iVar14 = QStyle::sliderPositionFromValue
                           (pQVar35[1].super_QStyleOption.type,
                            pQVar35[1].super_QStyleOption.state.
                            super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                            super_QFlagsStorage<QStyle::StateFlag>.i,
                            pQVar35[1].super_QStyleOption.rect.x2.m_i,iVar14 - iVar26,
                            SUB41(pQVar35[1].super_QStyleOption.rect.y1.m_i,0));
        iVar14 = iVar14 + RVar17.m_i;
        iStack_cc = iVar26 + -1 + iVar14;
        local_d8._4_4_ = iVar14;
        local_d8._0_4_ = RVar43.m_i;
        iStack_d0 = RVar15.m_i;
        if (pQVar35[1].super_QStyleOption.version == 1) {
          local_d8._4_4_ = RVar27.m_i;
          local_d8._0_4_ = iVar14;
          iStack_d0 = iStack_cc;
          iStack_cc = RVar30.m_i;
        }
        if (local_27c == SC_ComboBoxArrow) {
          bVar11 = pQVar35[1].super_QStyleOption.version == 1;
          piVar25 = (int *)local_d8;
          if (bVar11) {
            piVar25 = &iStack_d0;
          }
          RVar43.m_i = *piVar25;
          piVar25 = &iStack_cc;
          if (bVar11) {
            piVar25 = (int *)(local_d8 + 4);
          }
          RVar27.m_i = *piVar25;
LAB_0036d6cc:
          local_d8._4_4_ = RVar27.m_i;
          local_d8._0_4_ = RVar43.m_i;
          iStack_cc = RVar30.m_i;
          iStack_d0 = RVar15.m_i;
        }
        else if (local_27c == SC_ComboBoxListBoxPopup) {
          bVar11 = pQVar35[1].super_QStyleOption.version != 1;
          piVar25 = (int *)local_d8;
          if (bVar11) {
            piVar25 = &iStack_d0;
          }
          RVar15.m_i = *piVar25;
          piVar25 = (int *)(local_d8 + 4);
          if (!bVar11) {
            piVar25 = &iStack_cc;
          }
          RVar30.m_i = *piVar25;
          goto LAB_0036d6cc;
        }
        QVar51 = QStyle::visualRect(uStack_1e0._4_4_,(QRect *)local_278,(QRect *)local_d8);
        goto LAB_0036d320;
      }
switchD_0036cffd_caseD_3:
      bVar11 = hasStyleRule(this,&w->super_QObject,iVar26);
      if (!bVar11) goto LAB_0036d2be;
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,iVar26);
      if (((local_78.d.ptr == (QStyleSheetPositionData *)0x0) && (local_80 == (QSize)0x0)) &&
         (local_a0.d.ptr == (QStyleSheetBoxData *)0x0)) {
        QRenderRule::~QRenderRule((QRenderRule *)local_d8);
        goto LAB_0036d2be;
      }
      _local_298 = _local_278;
      if (local_160.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        if ((local_78.d.ptr == (QStyleSheetPositionData *)0x0) ||
           (OVar29 = *(Origin *)((long)local_78.d.ptr + 0x14), OVar29 == Origin_Unknown)) {
          OVar29 = Origin_Margin;
          if (iVar26 - 8U < 0x14) {
            OVar29 = *(Origin *)(&DAT_006800d4 + (ulong)(iVar26 - 8U) * 4);
          }
        }
        _local_298 = QRenderRule::originRect(&local_160,pQVar1,OVar29);
      }
      QVar51 = positionRect(this,w,(QRenderRule *)local_d8,iVar26,(QRect *)local_298,
                            uStack_1e0._4_4_);
      QRenderRule::~QRenderRule((QRenderRule *)local_d8);
    }
    else {
LAB_0036d2be:
      bVar11 = QRenderRule::baseStyleCanDraw(&local_160);
      if (bVar11) {
        pQVar18 = baseStyle(this);
        QVar51 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))(pQVar18,2,local_1e8,local_27c,w);
      }
      else {
        QVar51 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_ScrollBar,(QStyleOptionComplex *)local_1e8,
                            local_27c,w);
      }
    }
LAB_0036d320:
    pQVar34 = (QStyleSheetStyle *)(QVar51._0_8_ >> 0x20);
    QStyleOption::~QStyleOption((QStyleOption *)local_1e8);
    break;
  case CC_Slider:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       (pQVar35 = opt, (opt->super_QStyleOption).type != 0xf0001)) {
      pQVar35 = (QStyleOptionComplex *)0x0;
    }
    if (pQVar35 == (QStyleOptionComplex *)0x0) {
      bVar11 = false;
      pQVar20 = (QStyleOptionComplex *)this;
    }
    else {
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x31);
      bVar11 = QRenderRule::hasDrawable((QRenderRule *)local_d8);
      if (bVar11) {
        bVar11 = false;
        QSharedDataPointer<QStyleSheetImageData>::reset(&local_70,(QStyleSheetImageData *)0x0);
        stack0xfffffffffffffd90 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
        local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        _local_278 = positionRect(this,w,&local_160,(QRenderRule *)local_d8,0x31,
                                  &(opt->super_QStyleOption).rect,
                                  (opt->super_QStyleOption).direction);
        pQVar20 = local_278._0_8_;
        if (local_27c == SC_ComboBoxEditField) {
          uVar12 = pQVar35[1].super_QStyleOption.version;
          stack0xfffffffffffffd70 = (QRenderRule *)&DAT_aaaaaaaaaaaaaaaa;
          local_298._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          _local_298 = QRenderRule::contentsRect((QRenderRule *)local_d8,(QRect *)local_278);
          memset((QRenderRule *)local_1e8,0xaa,0x88);
          renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,0x32);
          QVar22 = QRenderRule::size((QRenderRule *)local_1e8);
          QVar19 = (QSize)((ulong)QVar22 >> 0x20);
          if ((uVar12 & 1) != 0) {
            QVar19 = QVar22;
          }
          QSharedDataPointer<QStyleSheetImageData>::reset(&local_180,(QStyleSheetImageData *)0x0);
          QVar10.d.ptr = local_190.d.ptr;
          if (local_190.d.ptr != (QStyleSheetGeometryData *)0x0) {
            local_190.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
            LOCK();
            *(int *)QVar10.d.ptr = *(int *)QVar10.d.ptr + -1;
            UNLOCK();
            if (*(int *)QVar10.d.ptr == 0) {
              operator_delete((void *)QVar10.d.ptr,0x1c);
            }
          }
          _local_298 = positionRect(this,w,(QRenderRule *)local_1e8,0x32,(QRect *)local_298,
                                    (opt->super_QStyleOption).direction);
          bVar11 = (uVar12 & 1) == 0;
          RVar27 = local_298._8_4_;
          RVar43.m_i = RStack_28c.m_i;
          if (bVar11) {
            RVar43.m_i = RVar27.m_i;
          }
          RVar15 = local_298._0_4_;
          RVar17.m_i = local_298._4_4_;
          if (bVar11) {
            RVar17.m_i = RVar15.m_i;
          }
          if (bVar11) {
            RVar15.m_i = local_298._4_4_;
            RVar27.m_i = RStack_28c.m_i;
          }
          iVar14 = (RVar43.m_i - RVar17.m_i) + 1;
          RVar40 = QVar19.wd.m_i;
          iVar26 = QStyle::sliderPositionFromValue
                             (pQVar35[1].super_QStyleOption.type,
                              pQVar35[1].super_QStyleOption.state.
                              super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                              super_QFlagsStorage<QStyle::StateFlag>.i,
                              pQVar35[1].super_QStyleOption.rect.x2.m_i,
                              (RVar27.m_i - (RVar15.m_i + RVar40.m_i)) + 1,
                              SUB41(pQVar35[1].super_QStyleOption.rect.y1.m_i,0));
          if ((uVar12 & 1) == 0) {
            local_298._4_4_ = iVar26 + local_298._4_4_;
            RVar33.m_i = RVar40.m_i;
            RVar40.m_i = iVar14;
          }
          else {
            local_298._0_4_ = local_298._0_4_ + iVar26;
            RVar33.m_i = iVar14;
          }
          local_298._8_4_ = RVar40.m_i + local_298._0_4_ + -1;
          RStack_28c.m_i = RVar33.m_i + -1 + local_298._4_4_;
          if (local_1b0.d.ptr == (QStyleSheetBoxData *)0x0) {
            local_2c8 = stack0xfffffffffffffd70;
            pQVar20 = (QStyleOptionComplex *)local_298._0_8_;
          }
          else {
            local_2c8 = (QRenderRule *)
                        CONCAT44(RStack_28c.m_i - *(int *)((long)local_1b0.d.ptr + 0xc),
                                 local_298._8_4_ - *(int *)((long)local_1b0.d.ptr + 8));
            pQVar20 = (QStyleOptionComplex *)
                      CONCAT44(local_298._4_4_ + *(int *)((long)local_1b0.d.ptr + 4),
                               local_298._0_4_ + *(int *)((long)local_1b0.d.ptr + 0x10));
          }
          QRenderRule::~QRenderRule((QRenderRule *)local_1e8);
          bVar11 = true;
          pQVar34 = (QStyleSheetStyle *)((ulong)pQVar20 >> 0x20);
        }
        else if (local_27c == SC_ComboBoxFrame) {
          bVar11 = true;
          pQVar34 = (QStyleSheetStyle *)((ulong)pQVar20 >> 0x20);
          local_2c8 = local_278._8_8_;
        }
      }
      else {
        bVar11 = false;
        pQVar20 = opt;
      }
      QPainterPath::~QPainterPath(local_58);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_68);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_70);
      if (local_78.d.ptr != (QStyleSheetPositionData *)0x0) {
        LOCK();
        *(int *)local_78.d.ptr = *(int *)local_78.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_78.d.ptr == 0) && (local_78.d.ptr != (QStyleSheetPositionData *)0x0)) {
          operator_delete((void *)local_78.d.ptr,0x24);
        }
      }
      if (local_80 != (QSize)0x0) {
        LOCK();
        *(int *)local_80 = *(int *)local_80 + -1;
        UNLOCK();
        if ((*(int *)local_80 == 0) && (local_80 != (QSize)0x0)) {
          operator_delete((void *)local_80,0x1c);
        }
      }
      QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_88);
      QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_90);
      QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_98);
      if (local_a0.d.ptr != (QStyleSheetBoxData *)0x0) {
        LOCK();
        *(int *)local_a0.d.ptr = *(int *)local_a0.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_a0.d.ptr == 0) && (local_a0.d.ptr != (QStyleSheetBoxData *)0x0)) {
          operator_delete((void *)local_a0.d.ptr,0x28);
        }
      }
      QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_a8);
      QHash<QString,_QVariant>::~QHash(&local_b0);
      QFont::~QFont((QFont *)&local_c8);
      QBrush::~QBrush((QBrush *)&iStack_d0);
      pQVar21 = local_2c8;
    }
    QVar51._8_8_ = pQVar21;
    QVar51._0_8_ = pQVar20;
    goto joined_r0x0036c075;
  case CC_ToolButton:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       (other_01 = (QStyleOptionToolButton *)opt, (opt->super_QStyleOption).type != 0xf0003)) {
      other_01 = (QStyleOptionToolButton *)0x0;
    }
    if (other_01 == (QStyleOptionToolButton *)0x0) goto switchD_0036b4b4_caseD_6;
    if ((local_160.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((local_160.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68))->d)
          .ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) != BorderStyle_Native)))))) {
      if (local_27c == SC_ComboBoxEditField) {
        memset((QRenderRule *)local_d8,0xaa,0x88);
        renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x11);
        LVar38 = (opt->super_QStyleOption).direction;
        iVar26 = 0x11;
        goto LAB_0036c944;
      }
      if (local_27c == SC_ComboBoxFrame) {
LAB_0036bd95:
        QVar51 = QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
        goto LAB_0036c218;
      }
    }
    memset((QStyleOptionToolButton *)local_d8,0xaa,0x98);
    QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)local_d8,other_01);
    local_c8 = QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
    bVar11 = QRenderRule::baseStyleCanDraw(&local_160);
    if (bVar11) {
      pQVar18 = baseStyle(this);
      QVar51 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))(pQVar18,4,local_d8,local_27c,w);
    }
    else {
      QVar51 = QCommonStyle::subControlRect
                         ((QCommonStyle *)this,CC_ToolButton,(QStyleOptionComplex *)local_d8,
                          local_27c,w);
    }
    pQVar34 = (QStyleSheetStyle *)(QVar51._0_8_ >> 0x20);
    QStyleOptionToolButton::~QStyleOptionToolButton((QStyleOptionToolButton *)local_d8);
    break;
  case CC_TitleBar:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       (pQVar35 = opt, (opt->super_QStyleOption).type != 0xf0005)) {
      pQVar35 = (QStyleOptionComplex *)0x0;
    }
    if (pQVar35 == (QStyleOptionComplex *)0x0) {
      bVar11 = false;
      local_2c8 = (QRenderRule *)0x0;
      pQVar21 = (QRenderRule *)this;
    }
    else {
      pQVar21 = (QRenderRule *)local_d8;
      memset(pQVar21,0xaa,0x88);
      renderRule(pQVar21,this,&w->super_QObject,&opt->super_QStyleOption,0x41);
      bVar11 = QRenderRule::hasDrawable(pQVar21);
      if (((bVar11) || (local_a0.d.ptr != (QStyleSheetBoxData *)0x0)) ||
         (local_90.d.ptr != (QStyleSheetBorderData *)0x0)) {
        local_1e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        titleBarLayout((QStyleSheetStyle *)local_1e8,(QWidget *)this,(QStyleOptionTitleBar *)w);
        QVar51 = QHash<QStyle::SubControl,_QRect>::value
                           ((QHash<QStyle::SubControl,_QRect> *)local_1e8,&local_27c);
        local_2c8 = QVar51._8_8_;
        pQVar21 = QVar51._0_8_;
        pQVar34 = (QStyleSheetStyle *)((ulong)pQVar21 >> 0x20);
        QHash<QStyle::SubControl,_QRect>::~QHash((QHash<QStyle::SubControl,_QRect> *)local_1e8);
        bVar11 = true;
      }
      else {
        bVar11 = false;
      }
      QPainterPath::~QPainterPath(local_58);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_68);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_70);
      if (local_78.d.ptr != (QStyleSheetPositionData *)0x0) {
        LOCK();
        *(int *)local_78.d.ptr = *(int *)local_78.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_78.d.ptr == 0) && (local_78.d.ptr != (QStyleSheetPositionData *)0x0)) {
          operator_delete((void *)local_78.d.ptr,0x24);
        }
      }
      if (local_80 != (QSize)0x0) {
        LOCK();
        *(int *)local_80 = *(int *)local_80 + -1;
        UNLOCK();
        if ((*(int *)local_80 == 0) && (local_80 != (QSize)0x0)) {
          operator_delete((void *)local_80,0x1c);
        }
      }
      QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_88);
      QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_90);
      QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_98);
      if (local_a0.d.ptr != (QStyleSheetBoxData *)0x0) {
        LOCK();
        *(int *)local_a0.d.ptr = *(int *)local_a0.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_a0.d.ptr == 0) && (local_a0.d.ptr != (QStyleSheetBoxData *)0x0)) {
          operator_delete((void *)local_a0.d.ptr,0x28);
        }
      }
      QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_a8);
      QHash<QString,_QVariant>::~QHash(&local_b0);
      QFont::~QFont((QFont *)&local_c8);
      QBrush::~QBrush((QBrush *)&iStack_d0);
    }
    QVar51._8_8_ = local_2c8;
    QVar51._0_8_ = pQVar21;
joined_r0x0036c075:
    if (!bVar11) {
switchD_0036b4b4_caseD_6:
      pQVar18 = baseStyle(this);
      lVar44 = *(long *)pQVar18;
LAB_0036c209:
      QVar51 = (QRect)(**(code **)(lVar44 + 0xd8))(pQVar18,cc,opt,local_27c,w);
LAB_0036c218:
      pQVar34 = (QStyleSheetStyle *)(QVar51._0_8_ >> 0x20);
    }
    break;
  default:
    goto switchD_0036b4b4_caseD_6;
  case CC_GroupBox:
    if (((opt == (QStyleOptionComplex *)0x0) || ((opt->super_QStyleOption).version < 1)) ||
       (other_00 = (QStyleOptionGroupBox *)opt, (opt->super_QStyleOption).type != 0xf0006)) {
      other_00 = (QStyleOptionGroupBox *)0x0;
    }
    if (other_00 == (QStyleOptionGroupBox *)0x0) goto switchD_0036b4b4_caseD_6;
    if ((local_27c != SC_ComboBoxListBoxPopup) && (local_27c != SC_ComboBoxArrow)) {
      memset((QRenderRule *)local_d8,0xaa,0x88);
      renderRule((QRenderRule *)local_d8,this,&w->super_QObject,&opt->super_QStyleOption,0x10);
      memset((QRenderRule *)local_1e8,0xaa,0x88);
      pQVar21 = renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,
                           0xf);
      auVar48._8_4_ = (int)local_190.d.ptr;
      auVar48._0_8_ = QStack_188.d.ptr;
      auVar48._12_4_ = local_190.d.ptr._4_4_;
      auVar50._8_8_ = local_1a0.d.ptr;
      auVar50._0_8_ = local_1b0.d.ptr;
      auVar50 = auVar50 | auVar48;
      auVar49._0_4_ = -(uint)(auVar50._0_4_ == 0);
      auVar49._4_4_ = -(uint)(auVar50._4_4_ == 0);
      auVar49._8_4_ = -(uint)(auVar50._8_4_ == 0);
      auVar49._12_4_ = -(uint)(auVar50._12_4_ == 0);
      iVar26 = movmskps((int)pQVar21,auVar49);
      if (((iVar26 == 0xf) &&
          ((local_80 == (QSize)0x0 ||
           ((*(int *)((long)local_80 + 0xc) == -1 && (*(int *)((long)local_80 + 0x10) == -1)))))) &&
         ((local_70.d.ptr == (QStyleSheetImageData *)0x0 ||
          (((((QSize *)((long)local_70.d.ptr + 0x14))->wd).m_i < 0 ||
           (((Representation *)((long)local_70.d.ptr + 0x18))->m_i < 0)))))) {
        memset((QStyleOptionGroupBox *)local_278,0xaa,0x88);
        QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)local_278,other_00);
        local_268 = (undefined1  [16])
                    QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
        pQVar18 = baseStyle(this);
        QVar51 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))
                                  (pQVar18,7,(QStyleOptionGroupBox *)local_278,local_27c,w);
        QStyleOptionGroupBox::~QStyleOptionGroupBox((QStyleOptionGroupBox *)local_278);
      }
      else {
        iVar26 = QFontMetrics::horizontalAdvance
                           ((QString *)&(opt->super_QStyleOption).fontMetrics,(int)other_00 + 0x50);
        uVar12 = QFontMetrics::height();
        iVar14 = (**(code **)(*(long *)this + 0xe0))(this,0x43,opt,w);
        iVar39 = (**(code **)(*(long *)this + 0xe0))(this,0x25,opt,w);
        uVar24 = (**(code **)(*(long *)this + 0xe0))(this,0x26,opt,w);
        uVar23 = (other_00->super_QStyleOptionComplex).subControls.
                 super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                 super_QFlagsStorage<QStyle::SubControl>.i & 1;
        iVar13 = (int)uVar24;
        uVar46 = uVar24 & 0xffffffff;
        if (iVar13 < (int)uVar12) {
          uVar46 = (ulong)uVar12;
        }
        if (uVar23 == 0) {
          uVar46 = (ulong)uVar12;
        }
        iVar26 = (-uVar23 & iVar14 + iVar39) + iVar26;
        iVar45 = (int)uVar46;
        if (local_190.d.ptr == (QStyleSheetGeometryData *)0x0) {
          ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
          (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i = 0;
          ptr->minWidth = iVar26;
          ptr->minHeight = iVar45;
          ptr->width = iVar26;
          ptr->height = iVar45;
          ptr->maxWidth = -1;
          ptr->maxHeight = -1;
          QSharedDataPointer<QStyleSheetGeometryData>::reset(&local_190,ptr);
        }
        else {
          if (*(int *)local_190.d.ptr != 1) {
            QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(&local_190);
          }
          *(int *)((long)local_190.d.ptr + 0xc) = iVar26;
          if ((local_190.d.ptr != (QStyleSheetGeometryData *)0x0) && (*(int *)local_190.d.ptr != 1))
          {
            QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(&local_190);
          }
          *(int *)((long)local_190.d.ptr + 0x10) = iVar45;
        }
        if (QStack_188.d.ptr == (QStyleSheetPositionData *)0x0) {
          ptr_00 = (QStyleSheetPositionData *)operator_new(0x24);
          IVar4 = (other_00->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i;
          ptr_00->super_QSharedData = (QAtomicInt)0x0;
          ptr_00->left = 0;
          ptr_00->top = 0;
          ptr_00->bottom = 0;
          ptr_00->right = 0;
          ptr_00->origin = Origin_Border;
          (ptr_00->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i = IVar4;
          ptr_00->mode = PositionMode_Static;
          ptr_00->textAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x0;
          QSharedDataPointer<QStyleSheetPositionData>::reset(&QStack_188,ptr_00);
        }
        stack0xfffffffffffffd90 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
        local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        _local_278 = positionRect(this,w,&local_160,(QRenderRule *)local_1e8,0xf,
                                  &(opt->super_QStyleOption).rect,
                                  (opt->super_QStyleOption).direction);
        IVar7 = (other_00->super_QStyleOptionComplex).subControls.
                super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                super_QFlagsStorage<QStyle::SubControl>.i;
        QVar51 = QRenderRule::contentsRect((QRenderRule *)local_1e8,(QRect *)local_278);
        if ((IVar7 & 1) != 0) {
          local_278._0_4_ = QVar51.x1.m_i;
          local_278._4_4_ = QVar51.y1.m_i;
          RStack_26c = QVar51.y2.m_i;
          RVar43.m_i = RStack_26c.m_i;
          stack0xfffffffffffffd90 = QVar51._8_8_;
          if (local_27c == SC_ComboBoxEditField) {
            lVar44 = (long)RVar43.m_i + (long)(int)local_278._4_4_;
            local_278._4_4_ =
                 (int)((ulong)(lVar44 - (lVar44 >> 0x3f)) >> 1) -
                 ((int)(uVar46 >> 0x1f) + iVar45 >> 1);
            local_278._0_4_ = iVar14 + iVar39 + local_278._0_4_;
            QVar51 = _local_278;
          }
          else {
            lVar44 = (long)RVar43.m_i + (long)(int)local_278._4_4_;
            local_278._4_4_ =
                 (int)((ulong)(lVar44 - (lVar44 >> 0x3f)) >> 1) -
                 ((int)(((uint)(uVar24 >> 0x1f) & 1) + iVar13) >> 1);
            local_278._8_4_ = iVar39 + local_278._0_4_ + -1;
            RStack_26c.m_i = iVar13 + -1 + local_278._4_4_;
            QVar51 = _local_278;
          }
        }
      }
      uVar24 = QVar51._0_8_;
      QRenderRule::~QRenderRule((QRenderRule *)local_1e8);
LAB_0036d1f1:
      pQVar34 = (QStyleSheetStyle *)(uVar24 >> 0x20);
      QRenderRule::~QRenderRule((QRenderRule *)local_d8);
      break;
    }
    if ((local_160.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((local_160.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_160.bd.d.ptr + 0x68))->d)
          .ptr == (QStyleSheetBorderImageData *)0x0 &&
         (*(BorderStyle *)((long)local_160.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
      memset((QStyleOptionGroupBox *)local_d8,0xaa,0x88);
      QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)local_d8,other_00);
      local_c8 = QRenderRule::borderRect(&local_160,&(opt->super_QStyleOption).rect);
      pQVar18 = baseStyle(this);
      QVar51 = (QRect)(**(code **)(*(long *)pQVar18 + 0xd8))
                                (pQVar18,7,(QStyleOptionGroupBox *)local_d8,local_27c,w);
      pQVar34 = (QStyleSheetStyle *)(QVar51._0_8_ >> 0x20);
      QStyleOptionGroupBox::~QStyleOptionGroupBox((QStyleOptionGroupBox *)local_d8);
      break;
    }
    if (local_27c == SC_ComboBoxListBoxPopup) goto LAB_0036bd95;
    QVar51 = QRenderRule::contentsRect(&local_160,&(opt->super_QStyleOption).rect);
    goto LAB_0036c218;
  case CC_MdiControls:
    bVar11 = hasStyleRule(this,&w->super_QObject,0x3e);
    if (!bVar11) {
      bVar11 = hasStyleRule(this,&w->super_QObject,0x40);
      if (!bVar11) {
        bVar11 = hasStyleRule(this,&w->super_QObject,0x3f);
        if (!bVar11) goto switchD_0036b4b4_caseD_6;
      }
    }
    local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffd90 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uStack_1e0 = (QVariant *)"button-layout";
    local_1e8._0_4_ = 0xd;
    local_1e8._4_4_ = 0;
    QHash<QString,_QVariant>::value<QLatin1String,_true>
              ((QVariant *)local_d8,&local_160.styleHints,(QLatin1String *)local_1e8);
    ::QVariant::toList();
    ::QVariant::~QVariant((QVariant *)local_d8);
    if (local_268._0_8_ == 0) {
      layout.m_data = "mNX";
      layout.m_size = 3;
      subControlLayout((QList<QVariant> *)local_1e8,layout);
      QVar51 = _local_1e8;
      uVar9 = QStack_1d8._0_8_;
      _local_1e8 = (QRect)ZEXT816(0);
      auVar6._8_8_ = 0;
      auVar6._0_4_ = QStack_1d8.x2.m_i;
      auVar6._4_4_ = QStack_1d8.y2.m_i;
      QStack_1d8 = (QRect)(auVar6 << 0x40);
      QVar53 = QStack_1d8;
      local_d8 = (undefined1  [8])local_278._0_8_;
      _iStack_d0 = stack0xfffffffffffffd90;
      uVar2 = local_268._0_8_;
      _local_278 = QVar51;
      QStack_1d8.x1.m_i = (int)uVar9;
      QStack_1d8.y1.m_i = SUB84(uVar9,4);
      local_268._0_4_ = QStack_1d8.x1.m_i;
      local_268._4_4_ = QStack_1d8.y1.m_i;
      auVar6 = local_268;
      local_268._0_4_ = (undefined4)uVar2;
      local_268._4_4_ = SUB84(uVar2,4);
      local_c8.x1.m_i = local_268._0_4_;
      local_c8.y1.m_i = local_268._4_4_;
      local_268 = auVar6;
      QStack_1d8 = QVar53;
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_d8);
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_1e8);
    }
    memset((QRenderRule *)local_d8,0xaa,0x88);
    QRenderRule::QRenderRule((QRenderRule *)local_d8);
    if (local_268._0_8_ == 0) {
      iVar26 = 0;
      RVar40.m_i = 0;
    }
    else {
      lVar44 = local_268._0_8_ << 5;
      QVar19.wd.m_i = 0;
      QVar19.ht.m_i = 0;
      iVar26 = 0;
      pQVar32 = stack0xfffffffffffffd90;
      do {
        uVar12 = ::QVariant::toInt((bool *)pQVar32);
        cVar36 = '\n';
        if ((0xfffffffc < uVar12 - 0x41) &&
           (SVar3 = knownPseudoElements[uVar12].subControl,
           ((opt->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
            super_QFlagsStorage<QStyle::SubControl>.i & SVar3) != SC_None)) {
          renderRule((QRenderRule *)local_1e8,this,&w->super_QObject,&opt->super_QStyleOption,uVar12
                    );
          QRenderRule::operator=((QRenderRule *)local_d8,(QRenderRule *)local_1e8);
          QPainterPath::~QPainterPath(local_168);
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&QStack_178);
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_180);
          if (QStack_188.d.ptr != (QStyleSheetPositionData *)0x0) {
            LOCK();
            *(int *)QStack_188.d.ptr = *(int *)QStack_188.d.ptr + -1;
            UNLOCK();
            if ((*(int *)QStack_188.d.ptr == 0) &&
               (QStack_188.d.ptr != (QStyleSheetPositionData *)0x0)) {
              operator_delete((void *)QStack_188.d.ptr,0x24);
            }
          }
          if (local_190.d.ptr != (QStyleSheetGeometryData *)0x0) {
            LOCK();
            *(int *)local_190.d.ptr = *(int *)local_190.d.ptr + -1;
            UNLOCK();
            if ((*(int *)local_190.d.ptr == 0) &&
               (local_190.d.ptr != (QStyleSheetGeometryData *)0x0)) {
              operator_delete((void *)local_190.d.ptr,0x1c);
            }
          }
          QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&QStack_198);
          QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_1a0);
          QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_1a8);
          if (local_1b0.d.ptr != (QStyleSheetBoxData *)0x0) {
            LOCK();
            *(int *)local_1b0.d.ptr = *(int *)local_1b0.d.ptr + -1;
            UNLOCK();
            if ((*(int *)local_1b0.d.ptr == 0) && (local_1b0.d.ptr != (QStyleSheetBoxData *)0x0)) {
              operator_delete((void *)local_1b0.d.ptr,0x28);
            }
          }
          QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_1b8);
          QHash<QString,_QVariant>::~QHash(&local_1c0);
          QFont::~QFont((QFont *)&QStack_1d8);
          QBrush::~QBrush((QBrush *)(local_1e8 + 8));
          if (local_80 == (QSize)0x0) {
            uVar24 = 0xffffffff;
            if ((local_70.d.ptr == (QStyleSheetImageData *)0x0) ||
               ((((QSize *)((long)local_70.d.ptr + 0x14))->wd).m_i < 0)) {
              QVar22.wd.m_i = -1;
              QVar22.ht.m_i = 0;
            }
            else {
              QVar22.wd.m_i = -1;
              QVar22.ht.m_i = 0;
              if (-1 < ((Representation *)((long)local_70.d.ptr + 0x18))->m_i) {
                QVar22 = *(QSize *)((long)local_70.d.ptr + 0x14);
                uVar24 = (ulong)QVar22 >> 0x20;
              }
            }
          }
          else {
            QVar22.ht.m_i = 0;
            QVar22.wd.m_i = *(int *)((long)local_80 + 0xc);
            uVar24 = (ulong)(uint)*(int *)((long)local_80 + 0x10);
          }
          uVar24 = (ulong)QVar22 & 0xffffffff | uVar24 << 0x20;
          local_1e8._0_4_ = (int)uVar24;
          local_1e8._4_4_ = (int)(uVar24 >> 0x20);
          QVar19 = QRenderRule::boxSize((QRenderRule *)local_d8,(QSize *)local_1e8,7);
          RVar40 = QVar19.wd.m_i;
          if (local_27c == SVar3) {
            RVar40.m_i = 0;
          }
          iVar26 = iVar26 + RVar40.m_i;
          cVar36 = (local_27c == SVar3) * '\t';
        }
        RVar40 = QVar19.wd.m_i;
        if ((cVar36 != '\n') && (cVar36 != '\0')) break;
        pQVar32 = pQVar32 + 1;
        lVar44 = lVar44 + -0x20;
      } while (lVar44 != 0);
    }
    iVar14 = (opt->super_QStyleOption).rect.y1.m_i;
    iVar39 = (opt->super_QStyleOption).rect.y2.m_i;
    iVar13 = iVar26 + RVar40.m_i + -1;
    if (local_a0.d.ptr == (QStyleSheetBoxData *)0x0) {
      uVar24 = CONCAT44(iVar14,iVar26);
    }
    else {
      iVar13 = iVar13 - *(int *)((long)local_a0.d.ptr + 8);
      iVar39 = iVar39 - *(int *)((long)local_a0.d.ptr + 0xc);
      uVar24 = CONCAT44(iVar14 + *(int *)((long)local_a0.d.ptr + 4),
                        iVar26 + *(int *)((long)local_a0.d.ptr + 0x10));
    }
    QVar51.y2.m_i = iVar39;
    QVar51.x2.m_i = iVar13;
    QVar51.x1.m_i = (int)uVar24;
    QVar51.y1.m_i = (int)(uVar24 >> 0x20);
    QPainterPath::~QPainterPath(local_58);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_68);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_70);
    if (local_78.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_78.d.ptr = *(int *)local_78.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_78.d.ptr == 0) && (local_78.d.ptr != (QStyleSheetPositionData *)0x0)) {
        operator_delete((void *)local_78.d.ptr,0x24);
      }
    }
    if (local_80 != (QSize)0x0) {
      LOCK();
      *(int *)local_80 = *(int *)local_80 + -1;
      UNLOCK();
      if ((*(int *)local_80 == 0) && (local_80 != (QSize)0x0)) {
        operator_delete((void *)local_80,0x1c);
      }
    }
    pQVar34 = (QStyleSheetStyle *)(uVar24 >> 0x20);
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_88);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_90);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_98);
    if (local_a0.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_a0.d.ptr = *(int *)local_a0.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_a0.d.ptr == 0) && (local_a0.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_a0.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_a8);
    QHash<QString,_QVariant>::~QHash(&local_b0);
    QFont::~QFont((QFont *)&local_c8);
    QBrush::~QBrush((QBrush *)&iStack_d0);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_278);
  }
  QPainterPath::~QPainterPath(&local_160.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_160.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_160.img);
  if (local_160.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_160.p.d.ptr = *(int *)local_160.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_160.p.d.ptr == 0) && (local_160.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_160.p.d.ptr,0x24);
    }
  }
  if (local_160.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_160.geo.d.ptr = *(int *)local_160.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_160.geo.d.ptr == 0) &&
       (local_160.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
      operator_delete((void *)local_160.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_160.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_160.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_160.bg);
  if (local_160.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_160.b.d.ptr = *(int *)local_160.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_160.b.d.ptr == 0) && (local_160.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_160.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_160.pal);
  QHash<QString,_QVariant>::~QHash(&local_160.styleHints);
  QFont::~QFont(&local_160.font);
  QBrush::~QBrush(&local_160.defaultBackground);
  if (pQVar8 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_0036c330:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar52._0_8_ = QVar51._0_8_ & 0xffffffff | (long)pQVar34 << 0x20;
  QVar52.x2.m_i = (int)QVar51._8_8_;
  QVar52.y2.m_i = (int)((ulong)QVar51._8_8_ >> 0x20);
  return QVar52;
}

Assistant:

QRect QStyleSheetStyle::subControlRect(ComplexControl cc, const QStyleOptionComplex *opt, SubControl sc,
                              const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subControlRect(cc, opt, sc, w))

    QRenderRule rule = renderRule(w, opt);
    switch (cc) {
    case CC_ComboBox:
        if (const QStyleOptionComboBox *cb = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ComboBoxFrame: return rule.borderRect(opt->rect);
                case SC_ComboBoxEditField:
                    {
                        QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                        QRect r = rule.contentsRect(opt->rect);
                        QRect r2 = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown,
                                opt->rect, opt->direction);
                        if (subRule.hasPosition() && subRule.position()->position & Qt::AlignLeft) {
                            return visualRect(opt->direction, r, r.adjusted(r2.width(),0,0,0));
                        } else {
                            return visualRect(opt->direction, r, r.adjusted(0,0,-r2.width(),0));
                        }
                    }
                case SC_ComboBoxArrow: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                    return positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                                                                           }
                case SC_ComboBoxListBoxPopup:
                default:
                    return baseStyle()->subControlRect(cc, opt, sc, w);
                }
            }

            QStyleOptionComboBox comboBox(*cb);
            comboBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &comboBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &comboBox, sc, w);
        }
        break;

#if QT_CONFIG(spinbox)
    case CC_SpinBox:
        if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            QRenderRule upRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
            QRenderRule downRule = renderRule(w, opt, PseudoElement_SpinBoxDownButton);
            bool ruleMatch = rule.hasBox() || !rule.hasNativeBorder();
            bool upRuleMatch = upRule.hasGeometry() || upRule.hasPosition();
            bool downRuleMatch = downRule.hasGeometry() || downRule.hasPosition();
            if (ruleMatch || upRuleMatch || downRuleMatch) {
                switch (sc) {
                case SC_SpinBoxFrame:
                    return rule.borderRect(opt->rect);
                case SC_SpinBoxEditField:
                    {
                        QRect r = rule.contentsRect(opt->rect);
                        // Use the widest button on each side to determine edit field size.
                        Qt::Alignment upAlign, downAlign;

                        upAlign = upRule.hasPosition() ? upRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        upAlign = resolveAlignment(opt->direction, upAlign);

                        downAlign = downRule.hasPosition() ? downRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        downAlign = resolveAlignment(opt->direction, downAlign);

                        const bool hasButtons = (spin->buttonSymbols != QAbstractSpinBox::NoButtons);
                        const int upSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxUp, w).width() : 0;
                        const int downSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxDown, w).width() : 0;

                        int widestL = qMax((upAlign & Qt::AlignLeft) ? upSize : 0,
                                (downAlign & Qt::AlignLeft) ? downSize : 0);
                        int widestR = qMax((upAlign & Qt::AlignRight) ? upSize : 0,
                                (downAlign & Qt::AlignRight) ? downSize : 0);
                        r.setRight(r.right() - widestR);
                        r.setLeft(r.left() + widestL);
                        return r;
                    }
                case SC_SpinBoxDown:
                    if (downRuleMatch)
                        return positionRect(w, rule, downRule, PseudoElement_SpinBoxDownButton,
                                opt->rect, opt->direction);
                    break;
                case SC_SpinBoxUp:
                    if (upRuleMatch)
                        return positionRect(w, rule, upRule, PseudoElement_SpinBoxUpButton,
                                opt->rect, opt->direction);
                    break;
                default:
                    break;
                }

                return baseStyle()->subControlRect(cc, opt, sc, w);
            }

            QStyleOptionSpinBox spinBox(*spin);
            spinBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &spinBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &spinBox, sc, w);
        }
        break;
#endif // QT_CONFIG(spinbox)

    case CC_GroupBox:
        if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            switch (sc) {
            case SC_GroupBoxFrame:
            case SC_GroupBoxContents: {
                if (rule.hasBox() || !rule.hasNativeBorder()) {
                    return sc == SC_GroupBoxFrame ? rule.borderRect(opt->rect)
                                                  : rule.contentsRect(opt->rect);
                }
                QStyleOptionGroupBox groupBox(*gb);
                groupBox.rect = rule.borderRect(opt->rect);
                return baseStyle()->subControlRect(cc, &groupBox, sc, w);
            }
            default:
            case SC_GroupBoxLabel:
            case SC_GroupBoxCheckBox: {
                QRenderRule indRule = renderRule(w, opt, PseudoElement_GroupBoxIndicator);
                QRenderRule labelRule = renderRule(w, opt, PseudoElement_GroupBoxTitle);
                if (!labelRule.hasPosition() && !labelRule.hasGeometry() && !labelRule.hasBox()
                    && !labelRule.hasBorder() && !indRule.hasContentsSize()) {
                    QStyleOptionGroupBox groupBox(*gb);
                    groupBox.rect = rule.borderRect(opt->rect);
                    return baseStyle()->subControlRect(cc, &groupBox, sc, w);
                }
                int tw = opt->fontMetrics.horizontalAdvance(gb->text);
                int th = opt->fontMetrics.height();
                int spacing = pixelMetric(QStyle::PM_CheckBoxLabelSpacing, opt, w);
                int iw = pixelMetric(QStyle::PM_IndicatorWidth, opt, w);
                int ih = pixelMetric(QStyle::PM_IndicatorHeight, opt, w);

                if (gb->subControls & QStyle::SC_GroupBoxCheckBox) {
                    tw = tw + iw + spacing;
                    th = qMax(th, ih);
                }
                if (!labelRule.hasGeometry()) {
                    labelRule.geo = new QStyleSheetGeometryData(tw, th, tw, th, -1, -1);
                } else {
                    labelRule.geo->width = tw;
                    labelRule.geo->height = th;
                }
                if (!labelRule.hasPosition()) {
                    labelRule.p = new QStyleSheetPositionData(0, 0, 0, 0, defaultOrigin(PseudoElement_GroupBoxTitle),
                                                              gb->textAlignment, PositionMode_Static);
                }
                QRect r = positionRect(w, rule, labelRule, PseudoElement_GroupBoxTitle,
                                      opt->rect, opt->direction);
                if (gb->subControls & SC_GroupBoxCheckBox) {
                    r = labelRule.contentsRect(r);
                    if (sc == SC_GroupBoxLabel) {
                        r.setLeft(r.left() + iw + spacing);
                        r.setTop(r.center().y() - th/2);
                    } else {
                        r = QRect(r.left(), r.center().y() - ih/2, iw, ih);
                    }
                    return r;
                } else {
                    return labelRule.contentsRect(r);
                }
            }
            } // switch
        }
        break;

    case CC_ToolButton:
        if (const QStyleOptionToolButton *tb = qstyleoption_cast<const QStyleOptionToolButton *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ToolButton: return rule.borderRect(opt->rect);
                case SC_ToolButtonMenu: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
                    return positionRect(w, rule, subRule, PseudoElement_ToolButtonMenu, opt->rect, opt->direction);
                                                                            }
                default:
                    break;
                }
            }

            QStyleOptionToolButton tool(*tb);
            tool.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &tool, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &tool, sc, w);
            }
            break;

#if QT_CONFIG(scrollbar)
    case CC_ScrollBar:
        if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QStyleOptionSlider styleOptionSlider(*sb);
            styleOptionSlider.rect = rule.borderRect(opt->rect);
            if (rule.hasDrawable() || rule.hasBox()) {
                QRect grooveRect;
                if (!rule.hasBox()) {
                    grooveRect = rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, sb, SC_ScrollBarGroove, w)
                                 : QWindowsStyle::subControlRect(cc, sb, SC_ScrollBarGroove, w);
                } else {
                    grooveRect = rule.contentsRect(opt->rect);
                }

                PseudoElement pe = PseudoElement_None;

                switch (sc) {
                case SC_ScrollBarGroove:
                    return grooveRect;
                case SC_ScrollBarAddPage:
                case SC_ScrollBarSubPage:
                case SC_ScrollBarSlider: {
                    QRect contentRect = grooveRect;
                    if (hasStyleRule(w, PseudoElement_ScrollBarSlider)) {
                        QRenderRule sliderRule = renderRule(w, opt, PseudoElement_ScrollBarSlider);
                        Origin origin = sliderRule.hasPosition() ? sliderRule.position()->origin : defaultOrigin(PseudoElement_ScrollBarSlider);
                        contentRect = rule.originRect(opt->rect, origin);
                    }
                    int maxlen = (styleOptionSlider.orientation == Qt::Horizontal) ? contentRect.width() : contentRect.height();
                    int sliderlen;
                    if (sb->maximum != sb->minimum) {
                        uint range = sb->maximum - sb->minimum;
                        sliderlen = (qint64(sb->pageStep) * maxlen) / (range + sb->pageStep);

                        int slidermin = pixelMetric(PM_ScrollBarSliderMin, sb, w);
                        if (sliderlen < slidermin || range > INT_MAX / 2)
                            sliderlen = slidermin;
                        if (sliderlen > maxlen)
                            sliderlen = maxlen;
                    } else {
                        sliderlen = maxlen;
                    }
                    int sliderstart = (styleOptionSlider.orientation == Qt::Horizontal ? contentRect.left() : contentRect.top())
                        + sliderPositionFromValue(sb->minimum, sb->maximum, sb->sliderPosition,
                                                  maxlen - sliderlen, sb->upsideDown);

                    QRect sr = (sb->orientation == Qt::Horizontal)
                               ? QRect(sliderstart, contentRect.top(), sliderlen, contentRect.height())
                               : QRect(contentRect.left(), sliderstart, contentRect.width(), sliderlen);
                    if (sc == SC_ScrollBarSubPage)
                        sr = QRect(contentRect.topLeft(), sb->orientation == Qt::Horizontal ? sr.bottomLeft() : sr.topRight());
                    else if (sc == SC_ScrollBarAddPage)
                        sr = QRect(sb->orientation == Qt::Horizontal ? sr.topRight() : sr.bottomLeft(), contentRect.bottomRight());
                    return visualRect(styleOptionSlider.direction, grooveRect, sr);
                }
                case SC_ScrollBarAddLine: pe = PseudoElement_ScrollBarAddLine; break;
                case SC_ScrollBarSubLine: pe = PseudoElement_ScrollBarSubLine; break;
                case SC_ScrollBarFirst: pe = PseudoElement_ScrollBarFirst;  break;
                case SC_ScrollBarLast: pe = PseudoElement_ScrollBarLast; break;
                default: break;
                }
                if (hasStyleRule(w,pe)) {
                    QRenderRule subRule = renderRule(w, opt, pe);
                    if (subRule.hasPosition() || subRule.hasGeometry() || subRule.hasBox()) {
                        const QStyleSheetPositionData *pos = subRule.position();
                        QRect originRect = grooveRect;
                        if (rule.hasBox()) {
                            Origin origin = (pos && pos->origin != Origin_Unknown) ? pos->origin : defaultOrigin(pe);
                            originRect = rule.originRect(opt->rect, origin);
                        }
                        return positionRect(w, subRule, pe, originRect, styleOptionSlider.direction);
                    }
                }
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &styleOptionSlider, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &styleOptionSlider, sc, w);
        }
        break;
#endif // QT_CONFIG(scrollbar)

#if QT_CONFIG(slider)
    case CC_Slider:
        if (const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_SliderGroove);
            if (!subRule.hasDrawable())
                break;
            subRule.img = nullptr;
            QRect gr = positionRect(w, rule, subRule, PseudoElement_SliderGroove, opt->rect, opt->direction);
            switch (sc) {
            case SC_SliderGroove:
                return gr;
            case SC_SliderHandle: {
                bool horizontal = slider->orientation & Qt::Horizontal;
                QRect cr = subRule.contentsRect(gr);
                QRenderRule subRule2 = renderRule(w, opt, PseudoElement_SliderHandle);
                int len = horizontal ? subRule2.size().width() : subRule2.size().height();
                subRule2.img = nullptr;
                subRule2.geo = nullptr;
                cr = positionRect(w, subRule2, PseudoElement_SliderHandle, cr, opt->direction);
                int thickness = horizontal ? cr.height() : cr.width();
                int sliderPos = sliderPositionFromValue(slider->minimum, slider->maximum, slider->sliderPosition,
                                                        (horizontal ? cr.width() : cr.height()) - len, slider->upsideDown);
                cr = horizontal ? QRect(cr.x() + sliderPos, cr.y(), len, thickness)
                                  : QRect(cr.x(), cr.y() + sliderPos, thickness, len);
                return subRule2.borderRect(cr);
                break; }
            case SC_SliderTickmarks:
                // TODO...
            default:
                break;
            }
        }
        break;
#endif // QT_CONFIG(slider)

    case CC_MdiControls:
        if (hasStyleRule(w, PseudoElement_MdiCloseButton)
            || hasStyleRule(w, PseudoElement_MdiNormalButton)
            || hasStyleRule(w, PseudoElement_MdiMinButton)) {
            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int x = 0, width = 0;
            QRenderRule subRule;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl control = knownPseudoElements[layoutButton].subControl;
                if (!(opt->subControls & control))
                    continue;
                subRule = renderRule(w, opt, layoutButton);
                width = subRule.size().width();
                if (sc == control)
                    break;
                x += width;
            }

            return subRule.borderRect(QRect(x, opt->rect.top(), width, opt->rect.height()));
        }
        break;

    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
            if (!subRule.hasDrawable() && !subRule.hasBox() && !subRule.hasBorder())
                break;
            QHash<QStyle::SubControl, QRect> layoutRects = titleBarLayout(w, tb);
            return layoutRects.value(sc);
        }
        break;

    default:
        break;
    }

    return baseStyle()->subControlRect(cc, opt, sc, w);
}